

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsInvalidTest::prepareNextTestCase
          (ImplicitConversionsInvalidTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  char *pcVar1;
  size_t sVar2;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  this->m_current_test_case_index = test_case_index;
  if (test_case_index < 4) {
    local_1a0._0_8_ = *(undefined8 *)(**(long **)&this->field_0x70 + 0x10);
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"T1:",3);
    pcVar1 = Utils::getTypeName::uint_lut[test_case_index];
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar1,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," T2:",4);
    pcVar1 = Utils::getTypeName::int_lut[test_case_index];
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar1,sVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
  }
  return test_case_index < 4;
}

Assistant:

bool ImplicitConversionsInvalidTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		return false;
	}
	else if (4 <= test_case_index)
	{
		return false;
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message
										<< "T1:" << Utils::getTypeName(Utils::UINT, 1, test_case_index + 1)
										<< " T2:" << Utils::getTypeName(Utils::INT, 1, test_case_index + 1)
										<< tcu::TestLog::EndMessage;

	return true;
}